

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

player_race * get_player_race(void)

{
  byte bVar1;
  bool bVar2;
  wchar_t wVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  player_race **pppVar7;
  ulong uVar8;
  player_race *ppVar9;
  bool bVar10;
  
  ppVar9 = races;
  pppVar7 = &races;
  bVar1 = player->themed_level;
  wVar3 = themed_level_index("Estolad");
  if ((wVar3 == (uint)bVar1) && (uVar4 = Rand_div(2), ppVar9 != (player_race *)0x0)) {
    bVar10 = uVar4 == 0;
    do {
      iVar5 = strcmp(ppVar9->hometown,"Ephel Brandir Town");
      bVar2 = bVar10;
      if ((iVar5 == 0) && (bVar2 = true, bVar10)) {
        return ppVar9;
      }
      bVar10 = bVar2;
      ppVar9 = ppVar9->next;
    } while (ppVar9 != (player_race *)0x0);
  }
  uVar4 = Rand_div(race_prob[(ulong)z_info->p_race_max - 1][player->place]);
  uVar6 = (ulong)z_info->p_race_max;
  if (z_info->p_race_max == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    do {
      if ((int)uVar4 < race_prob[uVar8][player->place]) {
        uVar6 = uVar8 & 0xffffffff;
        break;
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  do {
    pppVar7 = &((player_race *)pppVar7)->next->next;
    iVar5 = (int)uVar6;
    uVar6 = (ulong)(iVar5 - 1);
    if ((player_race *)pppVar7 == (player_race *)0x0) {
      return (player_race *)0x0;
    }
  } while (iVar5 != 0);
  return (player_race *)pppVar7;
}

Assistant:

struct player_race *get_player_race(void)
{
	struct player_race *p_race = races;
	int i, k;

	/* Special case -  Estolad themed level - Edain or Druedain */
	if (player->themed_level == themed_level_index("Estolad")) {
		/* Pick one of the races from Sphel Brandir */
		bool pick = (one_in_(2) ? true : false);
		while (p_race) {
			if (streq(p_race->hometown, "Ephel Brandir Town")) {
				if (pick) {
					return p_race;
				} else {
					pick = true;
				}
			}
			p_race = p_race->next;
		}
	}

	/* Pick one according to the probablilities */
	k = randint0(race_prob[z_info->p_race_max - 1][player->place]);
	for (i = 0; i < z_info->p_race_max; i++) {
		if (race_prob[i][player->place] > k) break;
	}

	/* Find the actual race */
	for (p_race = races; p_race; p_race = p_race->next) {
		if (i == 0) break;
		i--;
	}
	return p_race;
}